

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O0

void __thiscall GLDrawList::SortSpriteIntoWall(GLDrawList *this,SortNode *head,SortNode *sort)

{
  uint uVar1;
  GLDrawItem *pGVar2;
  GLWall *this_00;
  GLSprite *pGVar3;
  GLSprite *pGVar4;
  SortNode *child;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  SortNode *sort2;
  GLSprite s;
  float iu;
  float iy;
  float ix;
  double r;
  float v2;
  float v1;
  GLSprite *ss1;
  GLSprite *ss;
  GLWall *wh;
  SortNode *sort_local;
  SortNode *head_local;
  GLDrawList *this_local;
  
  pGVar2 = TArray<GLDrawItem,_GLDrawItem>::operator[](&this->drawitems,(long)head->itemindex);
  this_00 = TArray<GLWall,_GLWall>::operator[](&this->walls,(long)pGVar2->index);
  pGVar2 = TArray<GLDrawItem,_GLDrawItem>::operator[](&this->drawitems,(long)sort->itemindex);
  pGVar3 = TArray<GLSprite,_GLSprite>::operator[](&this->sprites,(long)pGVar2->index);
  fVar5 = GLWall::PointOnSide(this_00,pGVar3->x1,pGVar3->y1);
  fVar6 = GLWall::PointOnSide(this_00,pGVar3->x2,pGVar3->y2);
  dVar8 = std::fabs((double)(ulong)(uint)fVar5);
  if ((0.0005 <= SUB84(dVar8,0)) ||
     (dVar8 = std::fabs((double)(ulong)(uint)fVar6), 0.0005 <= SUB84(dVar8,0))) {
    if ((0.0005 <= fVar5) || (0.0005 <= fVar6)) {
      if ((fVar5 <= -0.0005) || (fVar6 <= -0.0005)) {
        dVar8 = GLSprite::CalcIntersectionVertex(pGVar3,this_00);
        fVar6 = (float)((double)pGVar3->x1 + dVar8 * (double)(pGVar3->x2 - pGVar3->x1));
        fVar7 = (float)((double)pGVar3->y1 + dVar8 * (double)(pGVar3->y2 - pGVar3->y1));
        s.lightlist._4_4_ = (float)((double)pGVar3->ul + dVar8 * (double)(pGVar3->ur - pGVar3->ul));
        memcpy(&sort2,pGVar3,0xa0);
        AddSprite(this,(GLSprite *)&sort2);
        uVar1 = TArray<GLSprite,_GLSprite>::Size(&this->sprites);
        pGVar3 = TArray<GLSprite,_GLSprite>::operator[](&this->sprites,(ulong)(uVar1 - 1));
        pGVar2 = TArray<GLDrawItem,_GLDrawItem>::operator[](&this->drawitems,(long)sort->itemindex);
        pGVar4 = TArray<GLSprite,_GLSprite>::operator[](&this->sprites,(long)pGVar2->index);
        pGVar4->x2 = fVar6;
        pGVar3->x1 = fVar6;
        pGVar4->y2 = fVar7;
        pGVar3->y1 = fVar7;
        pGVar4->ur = s.lightlist._4_4_;
        pGVar3->ul = s.lightlist._4_4_;
        child = StaticSortNodeArray::GetNew(&SortNodes);
        memset(child,0,0x30);
        uVar1 = TArray<GLDrawItem,_GLDrawItem>::Size(&this->drawitems);
        child->itemindex = uVar1 - 1;
        if (fVar5 <= 0.0) {
          SortNode::AddToLeft(head,sort);
          SortNode::AddToRight(head,child);
        }
        else {
          SortNode::AddToLeft(head,child);
          SortNode::AddToRight(head,sort);
        }
      }
      else {
        SortNode::AddToRight(head,sort);
      }
    }
    else {
      SortNode::AddToLeft(head,sort);
    }
  }
  else if (this_00->type == '\x05') {
    SortNode::AddToLeft(head,sort);
  }
  else {
    SortNode::AddToEqual(head,sort);
  }
  return;
}

Assistant:

void GLDrawList::SortSpriteIntoWall(SortNode * head,SortNode * sort)
{
	GLWall * wh=&walls[drawitems[head->itemindex].index];
	GLSprite * ss=&sprites[drawitems[sort->itemindex].index];
	GLSprite * ss1;

	float v1 = wh->PointOnSide(ss->x1, ss->y1);
	float v2 = wh->PointOnSide(ss->x2, ss->y2);

	if (fabs(v1)<MIN_EQ && fabs(v2)<MIN_EQ) 
	{
		if (wh->type==RENDERWALL_FOGBOUNDARY) 
		{
			head->AddToLeft(sort);
		}
		else 
		{
			head->AddToEqual(sort);
		}
	}
	else if (v1<MIN_EQ && v2<MIN_EQ) 
	{
		head->AddToLeft(sort);
	}
	else if (v1>-MIN_EQ && v2>-MIN_EQ) 
	{
		head->AddToRight(sort);
	}
	else
	{
		double r=ss->CalcIntersectionVertex(wh);

		float ix=(float)(ss->x1 + r * (ss->x2-ss->x1));
		float iy=(float)(ss->y1 + r * (ss->y2-ss->y1));
		float iu=(float)(ss->ul + r * (ss->ur-ss->ul));

		GLSprite s=*ss;
		AddSprite(&s);
		ss1=&sprites[sprites.Size()-1];
		ss=&sprites[drawitems[sort->itemindex].index];	// may have been reallocated!

		ss1->x1=ss->x2=ix;
		ss1->y1=ss->y2=iy;
		ss1->ul=ss->ur=iu;

		SortNode * sort2=SortNodes.GetNew();
		memset(sort2,0,sizeof(SortNode));
		sort2->itemindex=drawitems.Size()-1;

		if (v1>0)
		{
			head->AddToLeft(sort2);
			head->AddToRight(sort);
		}
		else
		{
			head->AddToLeft(sort);
			head->AddToRight(sort2);
		}
	}
}